

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

bool cppwinrt::has_factory_members(writer *w,TypeDef *type)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  TypeDef *in_RCX;
  pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
  local_48;
  
  get_factories_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
              *)&local_48,(cppwinrt *)w,(writer *)type,in_RCX);
  p_Var1 = &local_48._M_impl.super__Rb_tree_header;
  for (p_Var2 = local_48._M_impl.super__Rb_tree_header._M_header._M_left;
      ((_Rb_tree_header *)p_Var2 != p_Var1 && (*(long *)(p_Var2 + 2) != 0));
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    winmd::reader::TypeDef::MethodList(&local_68,(TypeDef *)(p_Var2 + 2));
    if ((local_68.first.super_row_base<winmd::reader::MethodDef>.m_table !=
         local_68.second.super_row_base<winmd::reader::MethodDef>.m_table) ||
       (local_68.first.super_row_base<winmd::reader::MethodDef>.m_index !=
        local_68.second.super_row_base<winmd::reader::MethodDef>.m_index)) break;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
  ::~_Rb_tree(&local_48);
  return (_Rb_tree_header *)p_Var2 != p_Var1;
}

Assistant:

static bool has_factory_members(writer& w, TypeDef const& type)
    {
        for (auto&&[factory_name, factory] : get_factories(w, type))
        {
            if (!factory.type || !empty(factory.type.MethodList()))
            {
                return true;
            }
        }

        return false;
    }